

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

bool __thiscall
cmGraphVizWriter::GenerateForTargetType(cmGraphVizWriter *this,TargetType targetType)

{
  TargetType targetType_local;
  cmGraphVizWriter *this_local;
  
  switch(targetType) {
  case EXECUTABLE:
    this_local._7_1_ = (bool)(this->GenerateForExecutables & 1);
    break;
  case STATIC_LIBRARY:
    this_local._7_1_ = (bool)(this->GenerateForStaticLibs & 1);
    break;
  case SHARED_LIBRARY:
    this_local._7_1_ = (bool)(this->GenerateForSharedLibs & 1);
    break;
  case MODULE_LIBRARY:
    this_local._7_1_ = (bool)(this->GenerateForModuleLibs & 1);
    break;
  default:
    this_local._7_1_ = false;
    break;
  case INTERFACE_LIBRARY:
    this_local._7_1_ = (bool)(this->GenerateForInterface & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool cmGraphVizWriter::GenerateForTargetType(
  cmStateEnums::TargetType targetType) const
{
  switch (targetType) {
    case cmStateEnums::EXECUTABLE:
      return this->GenerateForExecutables;
    case cmStateEnums::STATIC_LIBRARY:
      return this->GenerateForStaticLibs;
    case cmStateEnums::SHARED_LIBRARY:
      return this->GenerateForSharedLibs;
    case cmStateEnums::MODULE_LIBRARY:
      return this->GenerateForModuleLibs;
    case cmStateEnums::INTERFACE_LIBRARY:
      return this->GenerateForInterface;
    default:
      break;
  }
  return false;
}